

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * cppcms::util::md5hex(string *in)

{
  string *in_RDI;
  char buf [33];
  md5_state_t state;
  uchar data [16];
  md5_state_t *pms;
  undefined8 in_stack_ffffffffffffff20;
  int nbytes;
  md5_state_t *pms_00;
  string *this;
  md5_state_t *in_stack_ffffffffffffff30;
  char *out;
  allocator local_a9;
  char local_a8 [40];
  md5_state_t local_80;
  
  nbytes = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  pms = &local_80;
  this = in_RDI;
  impl::md5_init(pms);
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  impl::md5_append(in_stack_ffffffffffffff30,(md5_byte_t *)this,nbytes);
  pms_00 = (md5_state_t *)&stack0xffffffffffffffd8;
  impl::md5_finish(pms_00,(md5_byte_t *)pms);
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = '\0';
  local_a8[0x1b] = '\0';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = '\0';
  local_a8[0x1f] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_a8[0x20] = 0;
  out = local_a8;
  impl::tohex(pms_00,0x10,out);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,out,&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  return in_RDI;
}

Assistant:

std::string md5hex(std::string const &in)
{
	using namespace cppcms::impl;
	unsigned char data[16];
	md5_state_t state;
	md5_init(&state);
	md5_append(&state,reinterpret_cast<unsigned const char *>(in.c_str()),in.size());
	md5_finish(&state,data);
	char buf[33]={0};
	impl::tohex(data,sizeof(data),buf);
	return buf;
}